

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

void ZSTD_buildSeqTable_rle(ZSTD_seqSymbol *dt,U32 baseValue,U32 nbAddBits)

{
  ZSTD_seqSymbol *cell;
  ZSTD_seqSymbol_header *DTableH;
  void *ptr;
  U32 nbAddBits_local;
  U32 baseValue_local;
  ZSTD_seqSymbol *dt_local;
  
  dt->baseValue = 0;
  dt->nextState = 0;
  dt->nbAdditionalBits = '\0';
  dt->nbBits = '\0';
  dt[1].nbBits = '\0';
  dt[1].nextState = 0;
  dt[1].nbAdditionalBits = (BYTE)nbAddBits;
  dt[1].baseValue = baseValue;
  return;
}

Assistant:

static void ZSTD_buildSeqTable_rle(ZSTD_seqSymbol* dt, U32 baseValue, U32 nbAddBits)
{
    void* ptr = dt;
    ZSTD_seqSymbol_header* const DTableH = (ZSTD_seqSymbol_header*)ptr;
    ZSTD_seqSymbol* const cell = dt + 1;

    DTableH->tableLog = 0;
    DTableH->fastMode = 0;

    cell->nbBits = 0;
    cell->nextState = 0;
    assert(nbAddBits < 255);
    cell->nbAdditionalBits = (BYTE)nbAddBits;
    cell->baseValue = baseValue;
}